

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# device.c
# Opt level: O2

int nn_device_entry(nn_device_recipe *device,int s1,int s2,int flags)

{
  int iVar1;
  int *piVar2;
  char *pcVar3;
  uint uVar4;
  undefined8 uStackY_50;
  size_t local_38;
  nn_fd s2rcv;
  nn_fd s1snd;
  nn_fd s1rcv;
  int op2;
  int op1;
  nn_fd s2snd;
  
  uVar4 = device->required_checks;
  if ((s2 & s1) < 0 && (uVar4 & 1) != 0) {
    piVar2 = __errno_location();
    *piVar2 = 9;
    return -1;
  }
  if (((uVar4 & 2) != 0) && ((iVar1 = s1, s2 < 0 || (iVar1 = s2, s1 < 0)))) {
    nn_device_loopback(device,iVar1);
    return -1;
  }
  if ((uVar4 & 0x10) != 0) {
    local_38 = 4;
    iVar1 = nn_getsockopt(s1,0,0xc,&op1,&local_38);
    if (iVar1 != 0) {
      return -1;
    }
    if (local_38 != 4) {
      pcVar3 = "opsz == sizeof (op1)";
      uStackY_50 = 0x57;
      goto LAB_00118e77;
    }
    iVar1 = nn_getsockopt(s2,0,0xc,&op2,&local_38);
    if (iVar1 != 0) {
      return -1;
    }
    if (local_38 != 4) {
      pcVar3 = "opsz == sizeof (op2)";
      uStackY_50 = 0x5c;
      goto LAB_00118e77;
    }
    if ((op1 != 2) || (op2 != 2)) goto LAB_00118c17;
    uVar4 = device->required_checks;
  }
  if ((uVar4 & 0x20) != 0) {
    local_38 = 4;
    iVar1 = nn_getsockopt(s1,0,0xd,&op1,&local_38);
    if (iVar1 != 0) {
      return -1;
    }
    if (local_38 != 4) {
      pcVar3 = "opsz == sizeof (op1)";
      uStackY_50 = 0x69;
      goto LAB_00118e77;
    }
    iVar1 = nn_getsockopt(s2,0,0xd,&op2,&local_38);
    if (iVar1 != 0) {
      return -1;
    }
    if (local_38 != 4) {
      pcVar3 = "opsz == sizeof (op2)";
      uStackY_50 = 0x6e;
      goto LAB_00118e77;
    }
    if (op1 / 0x10 != op2 / 0x10) goto LAB_00118c17;
  }
  local_38 = 4;
  iVar1 = nn_getsockopt(s1,0,0xb,&s1rcv,&local_38);
  if (iVar1 < 0) {
    iVar1 = nn_errno();
    if (iVar1 != 0x5c) {
      return -1;
    }
    s1rcv = -1;
  }
  else {
    if (iVar1 != 0) {
      pcVar3 = "rc == 0";
      uStackY_50 = 0x7d;
      goto LAB_00118e77;
    }
    if (local_38 != 4) {
      pcVar3 = "opsz == sizeof (s1rcv)";
      uStackY_50 = 0x7e;
      goto LAB_00118e77;
    }
    if (s1rcv < 0) {
      pcVar3 = "s1rcv >= 0";
      uStackY_50 = 0x7f;
      goto LAB_00118e77;
    }
  }
  local_38 = 4;
  iVar1 = nn_getsockopt(s1,0,10,&s1snd,&local_38);
  if (iVar1 < 0) {
    iVar1 = nn_errno();
    if (iVar1 != 0x5c) {
      return -1;
    }
    s1snd = -1;
  }
  else {
    if (iVar1 != 0) {
      pcVar3 = "rc == 0";
      uStackY_50 = 0x88;
      goto LAB_00118e77;
    }
    if (local_38 != 4) {
      pcVar3 = "opsz == sizeof (s1snd)";
      uStackY_50 = 0x89;
      goto LAB_00118e77;
    }
    if (s1snd < 0) {
      pcVar3 = "s1snd >= 0";
      uStackY_50 = 0x8a;
      goto LAB_00118e77;
    }
  }
  local_38 = 4;
  iVar1 = nn_getsockopt(s2,0,0xb,&s2rcv,&local_38);
  if (iVar1 < 0) {
    iVar1 = nn_errno();
    if (iVar1 != 0x5c) {
      return -1;
    }
    s2rcv = -1;
  }
  else {
    if (iVar1 != 0) {
      pcVar3 = "rc == 0";
      uStackY_50 = 0x93;
      goto LAB_00118e77;
    }
    if (local_38 != 4) {
      pcVar3 = "opsz == sizeof (s2rcv)";
      uStackY_50 = 0x94;
      goto LAB_00118e77;
    }
    if (s2rcv < 0) {
      pcVar3 = "s2rcv >= 0";
      uStackY_50 = 0x95;
      goto LAB_00118e77;
    }
  }
  local_38 = 4;
  iVar1 = nn_getsockopt(s2,0,10,&s2snd,&local_38);
  if (iVar1 < 0) {
    iVar1 = nn_errno();
    if (iVar1 != 0x5c) {
      return -1;
    }
    s2snd = -1;
  }
  else {
    if (iVar1 != 0) {
      pcVar3 = "rc == 0";
      uStackY_50 = 0x9e;
      goto LAB_00118e77;
    }
    if (local_38 != 4) {
      pcVar3 = "opsz == sizeof (s2snd)";
      uStackY_50 = 0x9f;
      goto LAB_00118e77;
    }
    if (s2snd < 0) {
      pcVar3 = "s2snd >= 0";
      uStackY_50 = 0xa0;
      goto LAB_00118e77;
    }
  }
  uVar4 = device->required_checks;
  if (((uVar4 & 0x40) != 0) &&
     ((((s2snd == -1 && s1rcv != -1 || (s2rcv == -1 && s1snd != -1)) || (s1snd == -1 && s2rcv != -1)
       ) || (s1rcv == -1 && s2snd != -1)))) {
LAB_00118c17:
    piVar2 = __errno_location();
    *piVar2 = 0x16;
    return -1;
  }
  if (((uVar4 & 4) != 0) && ((s2snd != -1 && s2rcv != -1) && (s1snd != -1 && s1rcv != -1))) {
    nn_device_twoway(device,s1,s1rcv,s1snd,s2,s2rcv,s2snd);
    return -1;
  }
  if (((uVar4 & 8) != 0) &&
     ((uVar4 = s1snd & s2rcv, iVar1 = s1, (s2snd != -1 && s1rcv != -1) && uVar4 == 0xffffffff ||
      (((s1rcv == -1 && (s1snd != -1)) && ((s2rcv != -1 && (iVar1 = s2, s2 = s1, s2snd == -1))))))))
  {
    nn_device_oneway(device,iVar1,s1snd,s2,CONCAT31((int3)(uVar4 >> 8),uVar4 != 0xffffffff));
    return -1;
  }
  pcVar3 = "0";
  uStackY_50 = 200;
LAB_00118e77:
  fprintf(_stderr,"Assertion failed: %s (%s:%d)\n",pcVar3,
          "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/devices/device.c"
          ,uStackY_50);
  fflush(_stderr);
  nn_err_abort();
}

Assistant:

int nn_device_entry (struct nn_device_recipe *device, int s1, int s2,
    NN_UNUSED int flags) 
{
    int rc;
    int op1;
    int op2;
    nn_fd s1rcv;
    nn_fd s1snd;
    nn_fd s2rcv;
    nn_fd s2snd;
    size_t opsz;

    /*  At least one socket must be specified. */
    if (device->required_checks & NN_CHECK_AT_LEAST_ONE_SOCKET) {
        if (s1 < 0 && s2 < 0) {
            errno = EBADF;
            return -1;
        }
    }

    /*  Handle the case when there's only one socket in the device. */
    if (device->required_checks & NN_CHECK_ALLOW_LOOPBACK) {
        if (s2 < 0)
            return nn_device_loopback (device, s1);
        if (s1 < 0)
            return nn_device_loopback (device, s2);
    }

    /*  Check whether both sockets are "raw" sockets. */
    if (device->required_checks & NN_CHECK_REQUIRE_RAW_SOCKETS) {
        opsz = sizeof (op1);
        rc = nn_getsockopt (s1, NN_SOL_SOCKET, NN_DOMAIN, &op1, &opsz);
        if (rc != 0)
            return -1;
        nn_assert (opsz == sizeof (op1));
        opsz = sizeof (op2);
        rc = nn_getsockopt (s2, NN_SOL_SOCKET, NN_DOMAIN, &op2, &opsz);
        if (rc != 0)
            return -1;
        nn_assert (opsz == sizeof (op2));
        if (op1 != AF_SP_RAW || op2 != AF_SP_RAW) {
            errno = EINVAL;
            return -1;
        }
    }

    /*  Check whether both sockets are from the same protocol. */
    if (device->required_checks & NN_CHECK_SAME_PROTOCOL_FAMILY) {
        opsz = sizeof (op1);
        rc = nn_getsockopt (s1, NN_SOL_SOCKET, NN_PROTOCOL, &op1, &opsz);
        if (rc != 0)
            return -1;
        nn_assert (opsz == sizeof (op1));
        opsz = sizeof (op2);
        rc = nn_getsockopt (s2, NN_SOL_SOCKET, NN_PROTOCOL, &op2, &opsz);
        if (rc != 0)
            return -1;
        nn_assert (opsz == sizeof (op2));
        if (op1 / 16 != op2 / 16) {
            errno = EINVAL;
            return -1;
        }
    }

    /*  Get the file descriptors for polling. */
    opsz = sizeof (s1rcv);
    rc = nn_getsockopt (s1, NN_SOL_SOCKET, NN_RCVFD, &s1rcv, &opsz);
    if (rc < 0) {
        if (nn_errno () != ENOPROTOOPT)
            return -1;
        s1rcv = -1;
    } else {
        nn_assert (rc == 0);
        nn_assert (opsz == sizeof (s1rcv));
        nn_assert (s1rcv >= 0);
    }
    opsz = sizeof (s1snd);
    rc = nn_getsockopt (s1, NN_SOL_SOCKET, NN_SNDFD, &s1snd, &opsz);
    if (rc < 0) {
        if (nn_errno () != ENOPROTOOPT)
            return -1;
        s1snd = -1;
    } else {
        nn_assert (rc == 0);
        nn_assert (opsz == sizeof (s1snd));
        nn_assert (s1snd >= 0);
    }
    opsz = sizeof (s2rcv);
    rc = nn_getsockopt (s2, NN_SOL_SOCKET, NN_RCVFD, &s2rcv, &opsz);
    if (rc < 0) {
        if (nn_errno () != ENOPROTOOPT)
            return -1;
        s2rcv = -1;
    } else {
        nn_assert (rc == 0);
        nn_assert (opsz == sizeof (s2rcv));
        nn_assert (s2rcv >= 0);
    }
    opsz = sizeof (s2snd);
    rc = nn_getsockopt (s2, NN_SOL_SOCKET, NN_SNDFD, &s2snd, &opsz);
    if (rc < 0) {
        if (nn_errno () != ENOPROTOOPT)
            return -1;
        s2snd = -1;
    } else {
        nn_assert (rc == 0);
        nn_assert (opsz == sizeof (s2snd));
        nn_assert (s2snd >= 0);
    }
    if (device->required_checks & NN_CHECK_SOCKET_DIRECTIONALITY) {
        /*  Check the directionality of the sockets. */
        if (s1rcv != -1 && s2snd == -1) {
            errno = EINVAL;
            return -1;
        }
        if (s1snd != -1 && s2rcv == -1) {
            errno = EINVAL;
            return -1;
        }
        if (s2rcv != -1 && s1snd == -1) {
            errno = EINVAL;
            return -1;
        }
        if (s2snd != -1 && s1rcv == -1) {
            errno = EINVAL;
            return -1;
        }
    }

    /*  Two-directional device. */
    if (device->required_checks & NN_CHECK_ALLOW_BIDIRECTIONAL) {
        if (s1rcv != -1 && s1snd != -1 && s2rcv != -1 && s2snd != -1)
            return nn_device_twoway (device, s1, s1rcv, s1snd,
                s2, s2rcv, s2snd);
    }

    if (device->required_checks & NN_CHECK_ALLOW_UNIDIRECTIONAL) {
        /*  Single-directional device passing messages from s1 to s2. */
        if (s1rcv != -1 && s1snd == -1 && s2rcv == -1 && s2snd != -1)
            return nn_device_oneway (device,s1, s1rcv, s2, s2snd);

        /*  Single-directional device passing messages from s2 to s1. */
        if (s1rcv == -1 && s1snd != -1 && s2rcv != -1 && s2snd == -1)
            return nn_device_oneway (device,s2, s2rcv, s1, s1snd);
    }

    /*  This should never happen. */
    nn_assert (0);
}